

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLURL::buildFullText(XMLURL *this)

{
  short *psVar1;
  uint toFormat;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  XMLCh *pXVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  XMLCh *pXVar10;
  XMLCh tmpBuf [17];
  XMLCh local_48 [20];
  
  if (this->fFragment == (XMLCh *)0x0) {
    lVar3 = 0xb;
  }
  else {
    lVar3 = 0;
    do {
      psVar1 = (short *)((long)this->fFragment + lVar3);
      lVar3 = lVar3 + 2;
    } while (*psVar1 != 0);
    lVar3 = (lVar3 >> 1) + 10;
  }
  lVar5 = 0;
  if (this->fHost != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fHost + lVar5);
      lVar5 = lVar5 + 2;
    } while (*psVar1 != 0);
    lVar5 = (lVar5 >> 1) + -1;
  }
  lVar9 = 0;
  if (this->fPassword != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fPassword + lVar9);
      lVar9 = lVar9 + 2;
    } while (*psVar1 != 0);
    lVar9 = (lVar9 >> 1) + -1;
  }
  lVar6 = 0;
  if (this->fPath != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fPath + lVar6);
      lVar6 = lVar6 + 2;
    } while (*psVar1 != 0);
    lVar6 = (lVar6 >> 1) + -1;
  }
  lVar7 = 0;
  if (this->fQuery != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fQuery + lVar7);
      lVar7 = lVar7 + 2;
    } while (*psVar1 != 0);
    lVar7 = (lVar7 >> 1) + -1;
  }
  lVar8 = 0;
  if (this->fUser != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fUser + lVar8);
      lVar8 = lVar8 + 2;
    } while (*psVar1 != 0);
    lVar8 = (lVar8 >> 1) + -1;
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fURLText);
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(lVar9 + lVar6 + lVar3 + lVar5 + lVar7 + lVar8) * 2 + 0x42
                    );
  pXVar10 = (XMLCh *)CONCAT44(extraout_var,iVar2);
  this->fURLText = pXVar10;
  *pXVar10 = L'\0';
  if (this->fProtocol != Unknown) {
    pXVar4 = getProtocolName(this);
    XMLString::catString(pXVar10,pXVar4);
    lVar3 = 0;
    if (this->fURLText != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fURLText + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    (pXVar10 + lVar3)[0] = L':';
    (pXVar10 + lVar3)[1] = L'/';
    pXVar10[lVar3 + 2] = L'/';
    pXVar10 = pXVar10 + lVar3 + 3;
  }
  if (this->fUser != (XMLCh *)0x0) {
    XMLString::copyString(pXVar10,this->fUser);
    lVar3 = 0;
    if (this->fUser != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fUser + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    pXVar10 = pXVar10 + lVar3;
    pXVar4 = this->fPassword;
    if (pXVar4 != (XMLCh *)0x0) {
      *pXVar10 = L':';
      XMLString::copyString(pXVar10 + 1,pXVar4);
      lVar3 = 0;
      if (this->fPassword != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)this->fPassword + lVar3);
          lVar3 = lVar3 + 2;
        } while (*psVar1 != 0);
        lVar3 = (lVar3 >> 1) + -1;
      }
      pXVar10 = pXVar10 + 1 + lVar3;
    }
    *pXVar10 = L'@';
    pXVar10 = pXVar10 + 1;
  }
  if (this->fHost != (XMLCh *)0x0) {
    XMLString::copyString(pXVar10,this->fHost);
    lVar3 = 0;
    if (this->fHost != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fHost + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    pXVar10 = pXVar10 + lVar3;
    toFormat = this->fPortNum;
    if (toFormat != 0) {
      *pXVar10 = L':';
      XMLString::binToText(toFormat,local_48,0x10,10,this->fMemoryManager);
      XMLString::copyString(pXVar10 + 1,local_48);
      lVar3 = 0;
      do {
        psVar1 = (short *)((long)local_48 + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      pXVar10 = (XMLCh *)((long)pXVar10 + lVar3);
    }
  }
  if (this->fPath != (XMLCh *)0x0) {
    XMLString::copyString(pXVar10,this->fPath);
    lVar3 = 0;
    if (this->fPath != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fPath + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    pXVar10 = pXVar10 + lVar3;
  }
  pXVar4 = this->fQuery;
  if (pXVar4 != (XMLCh *)0x0) {
    *pXVar10 = L'?';
    XMLString::copyString(pXVar10 + 1,pXVar4);
    lVar3 = 0;
    if (this->fQuery != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fQuery + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    pXVar10 = pXVar10 + 1 + lVar3;
  }
  pXVar4 = this->fFragment;
  if (pXVar4 != (XMLCh *)0x0) {
    *pXVar10 = L'#';
    XMLString::copyString(pXVar10 + 1,pXVar4);
    lVar3 = 0;
    if (this->fFragment != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fFragment + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    pXVar10 = pXVar10 + 1 + lVar3;
  }
  *pXVar10 = L'\0';
  return;
}

Assistant:

void XMLURL::buildFullText()
{
    // Calculate the worst case size of the buffer required
    XMLSize_t bufSize = gMaxProtoLen + 1
                           + XMLString::stringLen(fFragment) + 1
                           + XMLString::stringLen(fHost) + 2
                           + XMLString::stringLen(fPassword) + 1
                           + XMLString::stringLen(fPath)
                           + XMLString::stringLen(fQuery) + 1
                           + XMLString::stringLen(fUser) + 1
                           + 32;

    // Clean up the existing buffer and allocate another
    fMemoryManager->deallocate(fURLText);//delete [] fURLText;
    fURLText = (XMLCh*) fMemoryManager->allocate((bufSize) * sizeof(XMLCh));//new XMLCh[bufSize];
    *fURLText = 0;

    XMLCh* outPtr = fURLText;
    if (fProtocol != Unknown)
    {
        XMLString::catString(fURLText, getProtocolName());
        outPtr += XMLString::stringLen(fURLText);
        *outPtr++ = chColon;
        *outPtr++ = chForwardSlash;
        *outPtr++ = chForwardSlash;
    }

    if (fUser)
    {
        XMLString::copyString(outPtr, fUser);
        outPtr += XMLString::stringLen(fUser);

        if (fPassword)
        {
            *outPtr++ = chColon;
            XMLString::copyString(outPtr, fPassword);
            outPtr += XMLString::stringLen(fPassword);
        }

        *outPtr++ = chAt;
    }

    if (fHost)
    {
        XMLString::copyString(outPtr, fHost);
        outPtr += XMLString::stringLen(fHost);

        //
        //  If the port is zero, then we don't put it in. Else we need
        //  to because it was explicitly provided.
        //
        if (fPortNum)
        {
            *outPtr++ = chColon;

            XMLCh tmpBuf[17];
            XMLString::binToText(fPortNum, tmpBuf, 16, 10, fMemoryManager);
            XMLString::copyString(outPtr, tmpBuf);
            outPtr += XMLString::stringLen(tmpBuf);
        }
    }

    if (fPath)
    {
        XMLString::copyString(outPtr, fPath);
        outPtr += XMLString::stringLen(fPath);
    }

    if (fQuery)
    {
        *outPtr++ = chQuestion;
        XMLString::copyString(outPtr, fQuery);
        outPtr += XMLString::stringLen(fQuery);
    }

    if (fFragment)
    {
        *outPtr++ = chPound;
        XMLString::copyString(outPtr, fFragment);
        outPtr += XMLString::stringLen(fFragment);
    }

    // Cap it off in case the last op was not a string copy
    *outPtr = 0;
}